

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_schedule_tblink(Terminal *term)

{
  unsigned_long uVar1;
  
  if (term->blink_is_real == true) {
    if (term->tblink_pending == false) {
      uVar1 = schedule_timer(0x1c2,term_timer,term);
      term->next_tblink = uVar1;
    }
    term->tblink_pending = true;
  }
  else {
    term->tblinker = true;
    term->tblink_pending = false;
  }
  return;
}

Assistant:

static void term_schedule_tblink(Terminal *term)
{
    if (term->blink_is_real) {
        if (!term->tblink_pending)
            term->next_tblink = schedule_timer(TBLINK_DELAY, term_timer, term);
        term->tblink_pending = true;
    } else {
        term->tblinker = true;         /* reset when not in use */
        term->tblink_pending = false;
    }
}